

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::GenerateRandomName_abi_cxx11_
          (string *__return_storage_ptr__,StringUtil *this,idx_t length)

{
  bool bVar1;
  double dVar2;
  RandomEngine engine;
  stringstream ss;
  ostream local_1a0 [376];
  
  RandomEngine::RandomEngine(&engine,-1);
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  while (bVar1 = this != (StringUtil *)0x0, this = this + -1, bVar1) {
    dVar2 = RandomEngine::NextRandom(&engine);
    ::std::operator<<(local_1a0,"0123456789abcdef"[(long)(dVar2 * 15.0) & 0xffffffff]);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  RandomEngine::~RandomEngine(&engine);
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::GenerateRandomName(idx_t length) {
	RandomEngine engine;
	std::stringstream ss;
	for (idx_t i = 0; i < length; i++) {
		ss << "0123456789abcdef"[engine.NextRandomInteger(0, 15)];
	}
	return ss.str();
}